

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.hpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> *
primesum::generate_prime_sums<unsigned_long>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,int64_t max
          )

{
  pointer puVar1;
  pointer puVar2;
  uint64_t i;
  ulong uVar3;
  initializer_list<unsigned_long> __l;
  allocator_type local_21;
  unsigned_long local_20;
  
  local_20 = 0;
  __l._M_len = 1;
  __l._M_array = &local_20;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (__return_storage_ptr__,__l,&local_21);
  primesieve::generate_primes<unsigned_long>(max,__return_storage_ptr__);
  puVar1 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (__return_storage_ptr__->
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar3 = 1; uVar3 < (ulong)((long)puVar2 - (long)puVar1 >> 3); uVar3 = uVar3 + 1) {
    puVar1[uVar3] = puVar1[uVar3] + puVar1[uVar3 - 1];
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> generate_prime_sums(int64_t max)
{
  std::vector<T> primes = { 0 };
  primesieve::generate_primes(max, &primes);

  for (uint64_t i = 1; i < primes.size(); i++)
    primes[i] += primes[i - 1];

  return primes;
}